

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

MatcherDescriberInterface *
testing::internal::
MatcherBase<std::tuple<unsigned_long,unsigned_long,pstore::file::file_base::lock_kind,pstore::file::file_base::blocking_mode>const&>
::
GetDescriberImpl<testing::internal::MatcherBase<std::tuple<unsigned_long,unsigned_long,pstore::file::file_base::lock_kind,pstore::file::file_base::blocking_mode>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>
          (MatcherBase<const_std::tuple<unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>_&>
           *m)

{
  return &m->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }